

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

Metric * __thiscall
hta::Directory::make_metric
          (Metric *__return_storage_ptr__,Directory *this,string *name,json *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_hta::storage::Directory_*,_false> _Var2;
  int iVar3;
  size_type sVar4;
  const_reference this_00;
  runtime_error *this_01;
  long *plVar5;
  size_type *psVar6;
  undefined8 uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mode_str;
  key_type local_d0;
  unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Meta local_48;
  
  uVar7 = 2;
  if (config->m_type == object) {
    sVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
            ::_M_count_tr<char[5],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                        *)(config->m_value).object,(char (*) [5])"mode");
    if (sVar4 != 0) {
      paVar1 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"mode","");
      this_00 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::at(config,&local_d0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_a8,this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar3 == 0) {
        uVar7 = 2;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar3 == 0) {
          uVar7 = 0;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_a8);
          uVar7 = 1;
          if (iVar3 != 0) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"unknown metric mode ","");
            std::operator+(&local_68,&local_88,&local_a8);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
            local_d0._M_dataplus._M_p = (pointer)*plVar5;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((size_type *)local_d0._M_dataplus._M_p == psVar6) {
              local_d0.field_2._M_allocated_capacity = *psVar6;
              local_d0.field_2._8_8_ = plVar5[3];
              local_d0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar6;
            }
            local_d0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::runtime_error::runtime_error(this_01,(string *)&local_d0);
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  _Var2._M_head_impl =
       (this->directory_)._M_t.
       super___uniq_ptr_impl<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>
       ._M_t.
       super__Tuple_impl<0UL,_hta::storage::Directory_*,_std::default_delete<hta::storage::Directory>_>
       .super__Head_base<0UL,_hta::storage::Directory_*,_false>._M_head_impl;
  Meta::Meta(&local_48,config);
  (**(_Var2._M_head_impl)->_vptr_Directory)
            (&local_b0,_Var2._M_head_impl,name,uVar7,in_R8,in_R9,
             (undefined4)local_48.interval_min.__r,(undefined4)local_48.interval_max.__r,
             local_48.interval_factor);
  Metric::Metric(__return_storage_ptr__,&local_b0);
  if (local_b0._M_t.
      super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
      super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
      super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>)0x0) {
    (**(code **)(*(long *)local_b0._M_t.
                          super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
                          .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl + 0x70)
    )();
  }
  return __return_storage_ptr__;
}

Assistant:

Metric Directory::make_metric(const std::string& name, const hta::json& config)
{
    Mode mode = Mode::read_write;
    if (config.count("mode"))
    {
        auto mode_str = config.at("mode").get<std::string>();
        if (mode_str == "RW")
        {
            mode = Mode::read_write;
        }
        else if (mode_str == "R")
        {
            mode = Mode::read;
        }
        else if (mode_str == "W")
        {
            mode = Mode::write;
        }
        else
        {
            throw std::runtime_error(std::string("unknown metric mode ") + mode_str +
                                     " supported modes are RW,R,W");
        }
    }
    return Metric(directory_->open(name, mode, Meta(config)));
}